

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtfmtsym.cpp
# Opt level: O0

void __thiscall
icu_63::DateFormatSymbols::setMonths
          (DateFormatSymbols *this,UnicodeString *monthsArray,int32_t count,DtContextType context,
          DtWidthType width)

{
  UnicodeString *pUVar1;
  UnicodeString *pUVar2;
  UnicodeString *pUVar3;
  DtWidthType width_local;
  DtContextType context_local;
  int32_t count_local;
  UnicodeString *monthsArray_local;
  DateFormatSymbols *this_local;
  
  if (context == FORMAT) {
    if (width == ABBREVIATED) {
      if ((this->fShortMonths != (UnicodeString *)0x0) &&
         (pUVar2 = this->fShortMonths, pUVar2 != (UnicodeString *)0x0)) {
        pUVar1 = pUVar2 + *(long *)((long)&pUVar2[-1].fUnion + 0x30);
        pUVar3 = monthsArray;
        while (pUVar2 != pUVar1) {
          pUVar1 = pUVar1 + -1;
          icu_63::UnicodeString::~UnicodeString(pUVar1);
        }
        UMemory::operator_delete__((UMemory *)((long)&pUVar2[-1].fUnion + 0x30),pUVar3);
      }
      pUVar2 = newUnicodeStringArray((long)count);
      this->fShortMonths = pUVar2;
      uprv_arrayCopy(monthsArray,this->fShortMonths,count);
      this->fShortMonthsCount = count;
    }
    else if (width == WIDE) {
      if ((this->fMonths != (UnicodeString *)0x0) &&
         (pUVar2 = this->fMonths, pUVar2 != (UnicodeString *)0x0)) {
        pUVar1 = pUVar2 + *(long *)((long)&pUVar2[-1].fUnion + 0x30);
        pUVar3 = monthsArray;
        while (pUVar2 != pUVar1) {
          pUVar1 = pUVar1 + -1;
          icu_63::UnicodeString::~UnicodeString(pUVar1);
        }
        UMemory::operator_delete__((UMemory *)((long)&pUVar2[-1].fUnion + 0x30),pUVar3);
      }
      pUVar2 = newUnicodeStringArray((long)count);
      this->fMonths = pUVar2;
      uprv_arrayCopy(monthsArray,this->fMonths,count);
      this->fMonthsCount = count;
    }
    else if (width == NARROW) {
      if ((this->fNarrowMonths != (UnicodeString *)0x0) &&
         (pUVar2 = this->fNarrowMonths, pUVar2 != (UnicodeString *)0x0)) {
        pUVar1 = pUVar2 + *(long *)((long)&pUVar2[-1].fUnion + 0x30);
        pUVar3 = monthsArray;
        while (pUVar2 != pUVar1) {
          pUVar1 = pUVar1 + -1;
          icu_63::UnicodeString::~UnicodeString(pUVar1);
        }
        UMemory::operator_delete__((UMemory *)((long)&pUVar2[-1].fUnion + 0x30),pUVar3);
      }
      pUVar2 = newUnicodeStringArray((long)count);
      this->fNarrowMonths = pUVar2;
      uprv_arrayCopy(monthsArray,this->fNarrowMonths,count);
      this->fNarrowMonthsCount = count;
    }
  }
  else if (context == STANDALONE) {
    if (width == ABBREVIATED) {
      if ((this->fStandaloneShortMonths != (UnicodeString *)0x0) &&
         (pUVar2 = this->fStandaloneShortMonths, pUVar2 != (UnicodeString *)0x0)) {
        pUVar1 = pUVar2 + *(long *)((long)&pUVar2[-1].fUnion + 0x30);
        pUVar3 = monthsArray;
        while (pUVar2 != pUVar1) {
          pUVar1 = pUVar1 + -1;
          icu_63::UnicodeString::~UnicodeString(pUVar1);
        }
        UMemory::operator_delete__((UMemory *)((long)&pUVar2[-1].fUnion + 0x30),pUVar3);
      }
      pUVar2 = newUnicodeStringArray((long)count);
      this->fStandaloneShortMonths = pUVar2;
      uprv_arrayCopy(monthsArray,this->fStandaloneShortMonths,count);
      this->fStandaloneShortMonthsCount = count;
    }
    else if (width == WIDE) {
      if ((this->fStandaloneMonths != (UnicodeString *)0x0) &&
         (pUVar2 = this->fStandaloneMonths, pUVar2 != (UnicodeString *)0x0)) {
        pUVar1 = pUVar2 + *(long *)((long)&pUVar2[-1].fUnion + 0x30);
        pUVar3 = monthsArray;
        while (pUVar2 != pUVar1) {
          pUVar1 = pUVar1 + -1;
          icu_63::UnicodeString::~UnicodeString(pUVar1);
        }
        UMemory::operator_delete__((UMemory *)((long)&pUVar2[-1].fUnion + 0x30),pUVar3);
      }
      pUVar2 = newUnicodeStringArray((long)count);
      this->fStandaloneMonths = pUVar2;
      uprv_arrayCopy(monthsArray,this->fStandaloneMonths,count);
      this->fStandaloneMonthsCount = count;
    }
    else if (width == NARROW) {
      if ((this->fStandaloneNarrowMonths != (UnicodeString *)0x0) &&
         (pUVar2 = this->fStandaloneNarrowMonths, pUVar2 != (UnicodeString *)0x0)) {
        pUVar1 = pUVar2 + *(long *)((long)&pUVar2[-1].fUnion + 0x30);
        pUVar3 = monthsArray;
        while (pUVar2 != pUVar1) {
          pUVar1 = pUVar1 + -1;
          icu_63::UnicodeString::~UnicodeString(pUVar1);
        }
        UMemory::operator_delete__((UMemory *)((long)&pUVar2[-1].fUnion + 0x30),pUVar3);
      }
      pUVar2 = newUnicodeStringArray((long)count);
      this->fStandaloneNarrowMonths = pUVar2;
      uprv_arrayCopy(monthsArray,this->fStandaloneNarrowMonths,count);
      this->fStandaloneNarrowMonthsCount = count;
    }
  }
  return;
}

Assistant:

void
DateFormatSymbols::setMonths(const UnicodeString* monthsArray, int32_t count, DtContextType context, DtWidthType width)
{
    // delete the old list if we own it
    // we always own the new list, which we create here (we duplicate rather
    // than adopting the list passed in)

    switch (context) {
    case FORMAT :
        switch (width) {
        case WIDE :
            if (fMonths)
                delete[] fMonths;
            fMonths = newUnicodeStringArray(count);
            uprv_arrayCopy( monthsArray,fMonths,count);
            fMonthsCount = count;
            break;
        case ABBREVIATED :
            if (fShortMonths)
                delete[] fShortMonths;
            fShortMonths = newUnicodeStringArray(count);
            uprv_arrayCopy( monthsArray,fShortMonths,count);
            fShortMonthsCount = count;
            break;
        case NARROW :
            if (fNarrowMonths)
                delete[] fNarrowMonths;
            fNarrowMonths = newUnicodeStringArray(count);
            uprv_arrayCopy( monthsArray,fNarrowMonths,count);
            fNarrowMonthsCount = count;
            break;
        default :
            break;
        }
        break;
    case STANDALONE :
        switch (width) {
        case WIDE :
            if (fStandaloneMonths)
                delete[] fStandaloneMonths;
            fStandaloneMonths = newUnicodeStringArray(count);
            uprv_arrayCopy( monthsArray,fStandaloneMonths,count);
            fStandaloneMonthsCount = count;
            break;
        case ABBREVIATED :
            if (fStandaloneShortMonths)
                delete[] fStandaloneShortMonths;
            fStandaloneShortMonths = newUnicodeStringArray(count);
            uprv_arrayCopy( monthsArray,fStandaloneShortMonths,count);
            fStandaloneShortMonthsCount = count;
            break;
        case NARROW :
           if (fStandaloneNarrowMonths)
                delete[] fStandaloneNarrowMonths;
            fStandaloneNarrowMonths = newUnicodeStringArray(count);
            uprv_arrayCopy( monthsArray,fStandaloneNarrowMonths,count);
            fStandaloneNarrowMonthsCount = count;
            break;
        default :
            break;
        }
        break;
    case DT_CONTEXT_COUNT :
        break;
    }
}